

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formula.cpp
# Opt level: O0

Formula * Kernel::Formula::createITE(Formula *condition,Formula *thenArg,Formula *elseArg)

{
  TermList elseBranch;
  Formula *pFVar1;
  TermList in_RDI;
  TermList iteTerm;
  TermList elseTerm;
  TermList thenTerm;
  Term *in_stack_ffffffffffffff88;
  TermList *in_stack_ffffffffffffff90;
  Formula *in_stack_ffffffffffffffa0;
  Formula *in_stack_ffffffffffffffa8;
  TermList in_stack_ffffffffffffffb0;
  undefined8 local_28;
  
  Term::createFormula(in_stack_ffffffffffffffa0);
  TermList::TermList(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  Term::createFormula(in_stack_ffffffffffffffa0);
  TermList::TermList(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  elseBranch = AtomicSort::boolSort();
  Term::createITE(in_stack_ffffffffffffffa8,local_28,elseBranch,in_stack_ffffffffffffffb0);
  TermList::TermList((TermList *)in_RDI._content,in_stack_ffffffffffffff88);
  pFVar1 = (Formula *)BoolTermFormula::operator_new(0x857139);
  BoolTermFormula::BoolTermFormula((BoolTermFormula *)in_stack_ffffffffffffff88,in_RDI);
  return pFVar1;
}

Assistant:

Formula* Formula::createITE(Formula* condition, Formula* thenArg, Formula* elseArg)
{
  TermList thenTerm(Term::createFormula(thenArg));
  TermList elseTerm(Term::createFormula(elseArg));
  TermList iteTerm(Term::createITE(condition, thenTerm, elseTerm, AtomicSort::boolSort()));
  return new BoolTermFormula(iteTerm);
}